

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aVaryingInterpolationTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles3::Accuracy::InterpolationCase::iterate(InterpolationCase *this)

{
  pointer *ppbVar1;
  float fVar2;
  float fVar3;
  Precision PVar4;
  pointer log;
  RenderContext *pRVar5;
  size_type sVar6;
  TestContext *this_00;
  undefined1 auVar7 [16];
  bool bVar8;
  int i;
  deUint32 dVar9;
  GLuint index;
  GLuint index_00;
  GLint GVar10;
  GLenum err;
  RenderTarget *pRVar11;
  char *__s;
  mapped_type *pmVar12;
  TestError *pTVar13;
  NotSupportedError *this_01;
  uint uVar14;
  uint uVar15;
  long lVar16;
  char *pcVar17;
  qpTestResult testResult;
  int iVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  Vec3 scale;
  Vec3 bias;
  Vector<float,_3> res_5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  float local_414;
  uint local_410;
  uint local_40c;
  float coords [12];
  Vector<float,_3> res_7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  Vector<float,_3> res_4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  Vec3 triB [2];
  Surface rendered;
  float positions [16];
  Surface reference;
  ProgramSources sources;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  templateParams;
  Random rnd;
  ShaderProgram program;
  
  log = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar9 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar9);
  pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar18 = pRVar11->m_width;
  if ((iVar18 < 0x80) || (pRVar11->m_height < 0x80)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small viewport",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aVaryingInterpolationTests.cpp"
               ,0xa3);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  dVar9 = deRandom_getUint32(&rnd.m_rnd);
  local_40c = dVar9 % (iVar18 - 0x7fU);
  iVar18 = pRVar11->m_height;
  dVar9 = deRandom_getUint32(&rnd.m_rnd);
  local_410 = dVar9 % (iVar18 - 0x7fU);
  templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &templateParams._M_t._M_impl.super__Rb_tree_header._M_header;
  templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  templateParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       templateParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  __s = glu::getPrecisionName(this->m_precision);
  ppbVar1 = &sources.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sources,"PRECISION","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&templateParams,(key_type *)&sources);
  pcVar17 = (char *)pmVar12->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,pcVar17,(ulong)__s);
  if (sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(sources.sources[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT44(sources.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             (int)sources.sources[0].
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage) + 1);
  }
  pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
  res_5.m_data._0_8_ = &local_428;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&res_5,
             "#version 300 es\nin highp vec4 a_position;\nin ${PRECISION} vec3 a_coords;\nout ${PRECISION} vec3 v_coords;\n\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coords = a_coords;\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)coords,(string *)&res_5);
  tcu::StringTemplate::specialize((string *)positions,(StringTemplate *)coords,&templateParams);
  res_7.m_data._0_8_ = &local_3c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&res_7,
             "#version 300 es\nin ${PRECISION} vec3 v_coords;\nuniform ${PRECISION} vec3 u_scale;\nuniform ${PRECISION} vec3 u_bias;\nlayout(location = 0) out ${PRECISION} vec4 o_color;\n\nvoid main (void)\n{\n\to_color = vec4(v_coords * u_scale + u_bias, 1.0);\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)triB,(string *)&res_7);
  tcu::StringTemplate::specialize((string *)&res_4,(StringTemplate *)triB,&templateParams);
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  sources._193_8_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&sources,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(sources.sources,(value_type *)positions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(sources.sources + 1,(value_type *)&res_4);
  glu::ShaderProgram::ShaderProgram(&program,pRVar5,&sources);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sources.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&sources.attribLocationBindings);
  lVar23 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&sources.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar23));
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res_4.m_data._0_8_ != &local_3a8) {
    operator_delete((void *)res_4.m_data._0_8_,
                    CONCAT44(local_3a8._M_allocated_capacity._4_4_,
                             local_3a8._M_allocated_capacity._0_4_) + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)triB);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res_7.m_data._0_8_ != &local_3c8) {
    operator_delete((void *)res_7.m_data._0_8_,
                    CONCAT44(local_3c8._M_allocated_capacity._4_4_,
                             local_3c8._M_allocated_capacity._0_4_) + 1);
  }
  if ((float *)CONCAT44(positions[1],positions[0]) != positions + 4) {
    operator_delete((float *)CONCAT44(positions[1],positions[0]),
                    CONCAT44(positions[5],positions[4]) + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)coords);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res_5.m_data._0_8_ != &local_428) {
    operator_delete((void *)res_5.m_data._0_8_,
                    CONCAT44(local_428._M_allocated_capacity._4_4_,
                             local_428._M_allocated_capacity._0_4_) + 1);
  }
  glu::operator<<((TestLog *)log,&program);
  if (program.m_program.m_info.linkOk == false) {
    if ((this->m_precision == PRECISION_HIGHP) &&
       (iVar18 = (*((this->super_TestCase).m_context)->m_contextInfo->_vptr_ContextInfo[7])(),
       (char)iVar18 == '\0')) {
      pcVar17 = "Fragment highp not supported";
      testResult = QP_TEST_RESULT_NOT_SUPPORTED;
    }
    else {
      pcVar17 = "Compile failed";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar17);
    goto LAB_01073f08;
  }
  bVar24 = this->m_projective != false;
  positions[0xc] = 1.0;
  if (bVar24) {
    fVar25 = 0.6;
    if (!bVar24) goto LAB_010731b8;
LAB_0107316b:
    fVar26 = 0.8;
    fVar28 = fVar26;
    if (bVar24) goto LAB_01073175;
LAB_010731bd:
    fVar27 = 1.0;
    fVar28 = fVar26;
  }
  else {
    fVar25 = 1.0;
    if (bVar24) goto LAB_0107316b;
LAB_010731b8:
    fVar26 = 1.0;
    fVar28 = positions[0xc];
    if (!bVar24) goto LAB_010731bd;
LAB_01073175:
    fVar27 = 1.3;
  }
  if (bVar24) {
    positions[0xc] = 2.0;
  }
  positions[0] = (float)((uint)fVar27 | 0x80000000);
  positions[1] = (float)((uint)fVar27 | 0x80000000);
  lVar23 = 0;
  positions[2] = 0.0;
  positions[3] = fVar27;
  positions[4] = (float)((uint)fVar28 | 0x80000000);
  positions[5] = fVar28;
  positions[6] = 0.0;
  positions[7] = fVar28;
  positions[8] = fVar25;
  positions[9] = (float)((uint)fVar25 | 0x80000000);
  positions[10] = 0.0;
  positions[0xb] = fVar25;
  positions[0xd] = positions[0xc];
  positions[0xe] = 0.0;
  positions[0xf] = positions[0xc];
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  do {
    *(float *)((long)&sources.sources[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar23 * 4) =
         (this->m_max).m_data[lVar23] - (this->m_min).m_data[lVar23];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  scale.m_data[2] = 0.0;
  scale.m_data[0] = 0.0;
  scale.m_data[1] = 0.0;
  lVar23 = 0;
  do {
    scale.m_data[lVar23] =
         1.0 / *(float *)((long)&sources.sources[0].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar23 * 4);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lVar23 = 0;
  do {
    *(float *)((long)&sources.sources[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar23 * 4) =
         -(this->m_min).m_data[lVar23];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  local_414 = positions[0xc];
  bias.m_data[2] = 0.0;
  bias.m_data[0] = 0.0;
  bias.m_data[1] = 0.0;
  lVar23 = 0;
  do {
    bias.m_data[lVar23] =
         *(float *)((long)&sources.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar23 * 4) *
         scale.m_data[lVar23];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  coords[0] = (0.0 - bias.m_data[0]) / scale.m_data[0];
  coords[1] = (0.5 - bias.m_data[1]) / scale.m_data[1];
  coords[2] = (1.0 - bias.m_data[2]) / scale.m_data[2];
  coords[3] = (0.5 - bias.m_data[0]) / scale.m_data[0];
  coords[4] = (1.0 - bias.m_data[1]) / scale.m_data[1];
  coords[5] = (0.5 - bias.m_data[2]) / scale.m_data[2];
  coords[7] = (0.0 - bias.m_data[1]) / scale.m_data[1];
  coords[9] = (1.0 - bias.m_data[0]) / scale.m_data[0];
  coords[0xb] = (0.0 - bias.m_data[2]) / scale.m_data[2];
  ppbVar1 = &sources.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  coords[6] = coords[3];
  coords[8] = coords[5];
  coords[10] = coords[1];
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppbVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppbVar1,"a_coords = ",0xb);
  lVar23 = 0;
  triB[0].m_data[2] = 0.0;
  triB[0].m_data[0] = 0.0;
  triB[0].m_data[1] = 0.0;
  res_4.m_data[0] = 0.0;
  res_4.m_data[1] = 0.0;
  res_4.m_data[2] = 0.0;
  do {
    res_4.m_data[lVar23] = triB[0].m_data[lVar23] - bias.m_data[lVar23];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  res_5.m_data[2] = 0.0;
  res_5.m_data[0] = 0.0;
  res_5.m_data[1] = 0.0;
  lVar23 = 0;
  do {
    res_5.m_data[lVar23] = res_4.m_data[lVar23] / scale.m_data[lVar23];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  tcu::operator<<((ostream *)ppbVar1,&res_5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppbVar1," -> ",4);
  lVar23 = 0;
  do {
    (&reference.m_width)[lVar23] = 0x3f800000;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  rendered.m_pixels.m_ptr._0_4_ = 0;
  rendered.m_width = 0;
  rendered.m_height = 0;
  lVar23 = 0;
  do {
    positions[lVar23 + -6] = (float)(&reference.m_width)[lVar23] - bias.m_data[lVar23];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  res_7.m_data[2] = 0.0;
  res_7.m_data[0] = 0.0;
  res_7.m_data[1] = 0.0;
  lVar23 = 0;
  do {
    res_7.m_data[lVar23] = positions[lVar23 + -6] / scale.m_data[lVar23];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  tcu::operator<<((ostream *)ppbVar1,&res_7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&sources,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppbVar1);
  std::ios_base::~ios_base((ios_base *)(sources.sources + 5));
  ppbVar1 = &sources.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppbVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppbVar1,"u_scale = ",10);
  tcu::operator<<((ostream *)ppbVar1,&scale);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&sources,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppbVar1);
  std::ios_base::~ios_base((ios_base *)(sources.sources + 5));
  ppbVar1 = &sources.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppbVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppbVar1,"u_bias = ",9);
  tcu::operator<<((ostream *)ppbVar1,&bias);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&sources,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppbVar1);
  std::ios_base::~ios_base((ios_base *)(sources.sources + 5));
  PVar4 = this->m_precision;
  uVar22 = 0;
  bVar24 = false;
  do {
    bVar8 = isValidFloat(PVar4,scale.m_data[uVar22]);
    if (!bVar8) break;
    bVar24 = 1 < uVar22;
    uVar22 = uVar22 + 1;
  } while (uVar22 != 3);
  if (bVar24) {
    PVar4 = this->m_precision;
    uVar22 = 0;
    bVar24 = false;
    do {
      bVar8 = isValidFloat(PVar4,bias.m_data[uVar22]);
      if (!bVar8) break;
      bVar24 = 1 < uVar22;
      uVar22 = uVar22 + 1;
    } while (uVar22 != 3);
    if (bVar24) {
      lVar23 = 0;
      uVar22 = 0;
      do {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar22;
        bVar24 = isValidFloat(this->m_precision,coords[uVar22]);
        if (!bVar24) {
          pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar13,(char *)0x0,"isValidFloat(m_precision, coords[ndx])",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aVaryingInterpolationTests.cpp"
                     ,0xed);
LAB_01073f8e:
          __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        lVar16 = lVar23 + (SUB168(auVar7 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU)
                          * -3;
        bVar24 = isValidFloat(this->m_precision,
                              coords[uVar22] * *(float *)((long)&scale + lVar16) +
                              *(float *)((long)&bias + lVar16));
        if (!bVar24) {
          pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar13,(char *)0x0,
                     "isValidFloat(m_precision, coords[ndx] * scale[ndx % 3] + bias[ndx % 3])",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aVaryingInterpolationTests.cpp"
                     ,0xee);
          goto LAB_01073f8e;
        }
        uVar22 = uVar22 + 1;
        lVar23 = lVar23 + 4;
      } while (uVar22 != 0xc);
      index = glwGetAttribLocation(program.m_program.m_program,"a_position");
      index_00 = glwGetAttribLocation(program.m_program.m_program,"a_coords");
      glwEnableVertexAttribArray(index);
      glwVertexAttribPointer(index,4,0x1406,'\0',0,positions);
      glwEnableVertexAttribArray(index_00);
      glwVertexAttribPointer(index_00,3,0x1406,'\0',0,coords);
      glwUseProgram(program.m_program.m_program);
      GVar10 = glwGetUniformLocation(program.m_program.m_program,"u_scale");
      glwUniform3f(GVar10,scale.m_data[0],scale.m_data[1],scale.m_data[2]);
      GVar10 = glwGetUniformLocation(program.m_program.m_program,"u_bias");
      glwUniform3f(GVar10,bias.m_data[0],bias.m_data[1],bias.m_data[2]);
      err = glwGetError();
      glu::checkError(err,"After program setup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aVaryingInterpolationTests.cpp"
                      ,0x103);
      tcu::Surface::Surface(&rendered,0x80,0x80);
      tcu::Surface::Surface(&reference,0x80,0x80);
      glwViewport(local_40c,local_410,0x80,0x80);
      glwDrawElements(4,6,0x1403,iterate::indices);
      pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)&sources,&reference,&pRVar11->m_pixelFormat);
      res_5.m_data[1] = coords[3];
      res_5.m_data[0] = coords[0];
      res_5.m_data[2] = coords[6];
      local_428._M_allocated_capacity._0_4_ = coords[6];
      local_428._M_allocated_capacity._4_4_ = coords[3];
      res_4.m_data[1] = coords[4];
      res_4.m_data[0] = coords[1];
      res_4.m_data[2] = coords[7];
      local_3a8._M_allocated_capacity._0_4_ = coords[7];
      local_3a8._M_allocated_capacity._4_4_ = coords[4];
      triB[0].m_data[1] = coords[5];
      triB[0].m_data[0] = coords[2];
      triB[0].m_data[2] = coords[8];
      triB[1].m_data[0] = coords[0xb];
      triB[1].m_data[1] = coords[8];
      triB[1].m_data[2] = coords[5];
      res_7.m_data[1] = fVar28;
      res_7.m_data[0] = fVar27;
      res_7.m_data[2] = fVar25;
      local_3c8._M_allocated_capacity._0_4_ = fVar25;
      local_3c8._M_allocated_capacity._4_4_ = fVar28;
      if (0 < (int)sources.sources[1].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
        local_414 = scale.m_data[1];
        iVar18 = 0;
        do {
          if (0 < sources.sources[0].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
            fVar25 = ((float)iVar18 + 0.5) /
                     (float)(int)sources.sources[1].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
            sVar6 = (sources.sources[0].
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
            iVar19 = 0;
            do {
              fVar26 = ((float)iVar19 + 0.5) /
                       (float)sources.sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              bVar24 = 1.0 <= fVar25 + fVar26;
              fVar28 = fVar25;
              if (bVar24) {
                fVar26 = 1.0 - fVar26;
                fVar28 = 1.0 - fVar25;
              }
              lVar23 = (ulong)((uint)bVar24 * 4) * 3;
              fVar30 = (1.0 - fVar26) - fVar28;
              fVar27 = *(float *)((long)res_7.m_data + lVar23);
              fVar2 = *(float *)((long)res_7.m_data + lVar23 + 4);
              fVar3 = *(float *)((long)res_7.m_data + lVar23 + 8);
              fVar31 = fVar26 / fVar3 + fVar28 / fVar2 + fVar30 / fVar27;
              uVar20 = 0xff000000;
              if (((uint)sources.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish & 1) != 0) {
                fVar29 = ((((&res_5)[bVar24].m_data[2] * fVar26) / fVar3 +
                          ((&res_5)[bVar24].m_data[1] * fVar28) / fVar2 +
                          ((&res_5)[bVar24].m_data[0] * fVar30) / fVar27) / fVar31) *
                         scale.m_data[0] + bias.m_data[0];
                uVar14 = 0x7e - ((int)fVar29 >> 0x17);
                uVar20 = (((uint)fVar29 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar14 & 0x1f)) +
                         0x800000;
                if (8 < uVar14) {
                  uVar20 = uVar14;
                }
                uVar20 = uVar20 >> 0x18 | 0xff000000;
              }
              uVar14 = 0;
              uVar21 = 0;
              if (((uint)sources.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish & 2) != 0) {
                fVar29 = (((*(float *)((long)res_4.m_data + lVar23 + 8) * fVar26) / fVar3 +
                          (*(float *)((long)res_4.m_data + lVar23 + 4) * fVar28) / fVar2 +
                          (*(float *)((long)res_4.m_data + lVar23) * fVar30) / fVar27) / fVar31) *
                         scale.m_data[1] + bias.m_data[1];
                uVar15 = 0x7e - ((int)fVar29 >> 0x17);
                uVar21 = (((uint)fVar29 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar15 & 0x1f)) +
                         0x800000;
                if (8 < uVar15) {
                  uVar21 = uVar15;
                }
                uVar21 = uVar21 >> 0x10 & 0xff00;
              }
              if (((uint)sources.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish & 4) != 0) {
                fVar28 = (((fVar26 * *(float *)((long)triB[0].m_data + lVar23 + 8)) / fVar3 +
                          (fVar28 * *(float *)((long)triB[0].m_data + lVar23 + 4)) / fVar2 +
                          (fVar30 * *(float *)((long)triB[0].m_data + lVar23)) / fVar27) / fVar31) *
                         scale.m_data[2] + bias.m_data[2];
                uVar15 = 0x7e - ((int)fVar28 >> 0x17);
                uVar14 = (((uint)fVar28 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar15 & 0x1f)) +
                         0x800000;
                if (8 < uVar15) {
                  uVar14 = uVar15;
                }
                uVar14 = uVar14 >> 8 & 0xff0000;
              }
              *(uint *)(sVar6 + (long)(sources.sources[0].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._4_4_ + iVar19 +
                                      ((int)sources.sources[0].
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      iVar18) * *(int *)&((sources.sources[0].
                                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p) * 4) = uVar21 | uVar20 | uVar14
              ;
              iVar19 = iVar19 + 1;
            } while (iVar19 < sources.sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          }
          iVar18 = iVar18 + 1;
        } while (iVar18 < (int)sources.sources[1].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      }
      pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
      res_5.m_data[0] = 1.12104e-44;
      res_5.m_data[1] = 4.2039e-45;
      if (rendered.m_pixels.m_cap != 0) {
        rendered.m_pixels.m_cap =
             CONCAT44(rendered.m_pixels.m_ptr._4_4_,rendered.m_pixels.m_ptr._0_4_);
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&sources,(TextureFormat *)&res_5,rendered.m_width,
                 rendered.m_height,1,(void *)rendered.m_pixels.m_cap);
      glu::readPixels(pRVar5,local_40c,local_410,(PixelBufferAccess *)&sources);
      iVar18 = tcu::measurePixelDiffAccuracy
                         ((TestLog *)log,"Result","Image comparison result",&reference,&rendered,
                          0x10,300,COMPARE_LOG_EVERYTHING);
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&sources);
      std::ostream::operator<<(&sources,iVar18);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sources);
      std::ios_base::~ios_base
                ((ios_base *)
                 &sources.sources[4].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)res_5.m_data._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res_5.m_data._0_8_ != &local_428) {
        operator_delete((void *)res_5.m_data._0_8_,
                        CONCAT44(local_428._M_allocated_capacity._4_4_,
                                 local_428._M_allocated_capacity._0_4_) + 1);
      }
      tcu::Surface::~Surface(&reference);
      tcu::Surface::~Surface(&rendered);
LAB_01073f08:
      glu::ShaderProgram::~ShaderProgram(&program);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&templateParams._M_t);
      return STOP;
    }
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar13,(char *)0x0,"isValidFloatVec(m_precision, bias)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aVaryingInterpolationTests.cpp"
               ,0xea);
  }
  else {
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar13,(char *)0x0,"isValidFloatVec(m_precision, scale)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aVaryingInterpolationTests.cpp"
               ,0xe9);
  }
  __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

InterpolationCase::IterateResult InterpolationCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	int							viewportWidth	= 128;
	int							viewportHeight	= 128;

	if (renderTarget.getWidth() < viewportWidth ||
		renderTarget.getHeight() < viewportHeight)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	int							viewportX		= rnd.getInt(0, renderTarget.getWidth()		- viewportWidth);
	int							viewportY		= rnd.getInt(0, renderTarget.getHeight()	- viewportHeight);

	static const char* s_vertShaderTemplate =
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in ${PRECISION} vec3 a_coords;\n"
		"out ${PRECISION} vec3 v_coords;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_coords = a_coords;\n"
		"}\n";
	static const char* s_fragShaderTemplate =
		"#version 300 es\n"
		"in ${PRECISION} vec3 v_coords;\n"
		"uniform ${PRECISION} vec3 u_scale;\n"
		"uniform ${PRECISION} vec3 u_bias;\n"
		"layout(location = 0) out ${PRECISION} vec4 o_color;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	o_color = vec4(v_coords * u_scale + u_bias, 1.0);\n"
		"}\n";

	map<string, string> templateParams;
	templateParams["PRECISION"] = glu::getPrecisionName(m_precision);

	glu::ShaderProgram program(m_context.getRenderContext(),
							   glu::makeVtxFragSources(tcu::StringTemplate(s_vertShaderTemplate).specialize(templateParams),
													   tcu::StringTemplate(s_fragShaderTemplate).specialize(templateParams)));
	log << program;
	if (!program.isOk())
	{
		if (m_precision == glu::PRECISION_HIGHP && !m_context.getContextInfo().isFragmentHighPrecisionSupported())
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Fragment highp not supported");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	// Position coordinates.
	Vec4 wCoord = m_projective ? Vec4(1.3f, 0.8f, 0.6f, 2.0f) : Vec4(1.0f, 1.0f, 1.0f, 1.0f);
	float positions[] =
	{
		-1.0f*wCoord.x(), -1.0f*wCoord.x(), 0.0f, wCoord.x(),
		-1.0f*wCoord.y(), +1.0f*wCoord.y(), 0.0f, wCoord.y(),
		+1.0f*wCoord.z(), -1.0f*wCoord.z(), 0.0f, wCoord.z(),
		+1.0f*wCoord.w(), +1.0f*wCoord.w(), 0.0f, wCoord.w()
	};

	// Coordinates for interpolation.
	tcu::Vec3 scale	= 1.0f / (m_max - m_min);
	tcu::Vec3 bias	= -1.0f*m_min*scale;
	float coords[] =
	{
		(0.0f - bias[0])/scale[0], (0.5f - bias[1])/scale[1], (1.0f - bias[2])/scale[2],
		(0.5f - bias[0])/scale[0], (1.0f - bias[1])/scale[1], (0.5f - bias[2])/scale[2],
		(0.5f - bias[0])/scale[0], (0.0f - bias[1])/scale[1], (0.5f - bias[2])/scale[2],
		(1.0f - bias[0])/scale[0], (0.5f - bias[1])/scale[1], (0.0f - bias[2])/scale[2]
	};

	log << TestLog::Message << "a_coords = " << ((tcu::Vec3(0.0f) - bias)/scale) << " -> " << ((tcu::Vec3(1.0f) - bias)/scale) << TestLog::EndMessage;
	log << TestLog::Message << "u_scale = " << scale << TestLog::EndMessage;
	log << TestLog::Message << "u_bias = " << bias << TestLog::EndMessage;

	// Verify that none of the inputs are denormalized / inf / nan.
	TCU_CHECK(isValidFloatVec(m_precision, scale));
	TCU_CHECK(isValidFloatVec(m_precision, bias));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(coords); ndx++)
	{
		TCU_CHECK(isValidFloat(m_precision, coords[ndx]));
		TCU_CHECK(isValidFloat(m_precision, coords[ndx] * scale[ndx % 3] + bias[ndx % 3]));
	}

	// Indices.
	static const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

	{
		const int	posLoc		= glGetAttribLocation(program.getProgram(), "a_position");
		const int	coordLoc	= glGetAttribLocation(program.getProgram(), "a_coords");

		glEnableVertexAttribArray(posLoc);
		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &positions[0]);

		glEnableVertexAttribArray(coordLoc);
		glVertexAttribPointer(coordLoc, 3, GL_FLOAT, GL_FALSE, 0, &coords[0]);
	}

	glUseProgram(program.getProgram());
	glUniform3f(glGetUniformLocation(program.getProgram(), "u_scale"), scale.x(), scale.y(), scale.z());
	glUniform3f(glGetUniformLocation(program.getProgram(), "u_bias"), bias.x(), bias.y(), bias.z());

	GLU_CHECK_MSG("After program setup");

	// Frames.
	tcu::Surface	rendered		(viewportWidth, viewportHeight);
	tcu::Surface	reference		(viewportWidth, viewportHeight);

	// Render with GL.
	glViewport(viewportX, viewportY, viewportWidth, viewportHeight);
	glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, &indices[0]);

	// Render reference \note While GPU is hopefully doing our draw call.
	renderReference(SurfaceAccess(reference, m_context.getRenderTarget().getPixelFormat()), coords, wCoord, scale, bias);

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, rendered.getAccess());

	// Compute difference.
	const int		bestScoreDiff	= 16;
	const int		worstScoreDiff	= 300;
	int				score			= tcu::measurePixelDiffAccuracy(log, "Result", "Image comparison result", reference, rendered, bestScoreDiff, worstScoreDiff, tcu::COMPARE_LOG_EVERYTHING);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	return STOP;
}